

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactorNull.cpp
# Opt level: O0

int __thiscall
pele::physics::reactions::ReactorNull::react
          (ReactorNull *this,Box *box,Array4<double> *rY_in,Array4<double> *rYsrc_in,
          Array4<double> *T_in,Array4<double> *rEner_in,Array4<double> *rEner_src_in,
          Array4<double> *FC_in,Array4<int> *param_9,Real *dt_react,Real *param_11)

{
  void *in_RCX;
  void *in_RDX;
  long in_RDI;
  void *in_R8;
  void *in_R9;
  void *in_stack_00000008;
  void *in_stack_00000010;
  int captured_reactor_type;
  undefined1 local_1c8 [64];
  anon_class_400_8_ae3fe602 *in_stack_fffffffffffffe78;
  Box *in_stack_fffffffffffffe80;
  undefined1 auStack_140 [64];
  undefined1 auStack_100 [64];
  undefined1 auStack_c0 [64];
  undefined4 local_80;
  undefined1 auStack_78 [68];
  undefined4 local_34;
  void *local_28;
  void *local_20;
  void *local_18;
  
  local_34 = *(undefined4 *)(in_RDI + 100);
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  memcpy(local_1c8,in_R9,0x3c);
  memcpy(&stack0xfffffffffffffe78,in_stack_00000008,0x3c);
  memcpy(auStack_140,local_18,0x3c);
  memcpy(auStack_100,local_20,0x3c);
  memcpy(auStack_c0,local_28,0x3c);
  local_80 = local_34;
  memcpy(auStack_78,in_stack_00000010,0x3c);
  amrex::
  ParallelFor<pele::physics::reactions::ReactorNull::react(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<int>const&,double&,double&)::__0>
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  return 0;
}

Assistant:

int
ReactorNull::react(
  const amrex::Box& box,
  amrex::Array4<amrex::Real> const& rY_in,
  amrex::Array4<amrex::Real> const& rYsrc_in,
  amrex::Array4<amrex::Real> const& T_in,
  amrex::Array4<amrex::Real> const& rEner_in,
  amrex::Array4<amrex::Real> const& rEner_src_in,
  amrex::Array4<amrex::Real> const& FC_in,
  amrex::Array4<int> const& /*mask*/,
  amrex::Real& dt_react,
  amrex::Real&
#ifdef MOD_REACTOR
    time
#endif
#ifdef AMREX_USE_GPU
  ,
  amrex::gpuStream_t /*stream*/
#endif
)
{
#ifdef MOD_REACTOR
  amrex::Real time_init = time;
#endif

  int captured_reactor_type = m_reactor_type;

  ParallelFor(box, [=] AMREX_GPU_DEVICE(int i, int j, int k) noexcept {
    amrex::Real renergy_loc =
      rEner_in(i, j, k, 0) + rEner_src_in(i, j, k, 0) * dt_react;
    rEner_in(i, j, k, 0) = renergy_loc;
    amrex::Real rY_loc[NUM_SPECIES];
    for (int n = 0; n < NUM_SPECIES; n++) {
      rY_loc[n] = rY_in(i, j, k, n) + rYsrc_in(i, j, k, n) * dt_react;
      rY_in(i, j, k, n) = rY_loc[n];
    }
    amrex::Real rho_loc = 0.0;
    for (amrex::Real n : rY_loc) {
      rho_loc += n;
    }
    amrex::Real Y_loc[NUM_SPECIES];
    for (int n = 0; n < NUM_SPECIES; n++) {
      Y_loc[n] = rY_loc[n] / rho_loc;
    }
    amrex::Real energy_loc = renergy_loc / rho_loc;
    amrex::Real T_loc = T_in(i, j, k, 0);
    auto eos = pele::physics::PhysicsType::eos();
    if (captured_reactor_type == ReactorTypes::e_reactor_type) {
      eos.REY2T(rho_loc, energy_loc, Y_loc, T_loc);
    } else if (captured_reactor_type == ReactorTypes::h_reactor_type) {
      eos.RHY2T(rho_loc, energy_loc, Y_loc, T_loc);
    } else {
      amrex::Abort("Wrong reactor type. Choose between 1 (e) or 2 (h).");
    }
    T_in(i, j, k, 0) = T_loc;
    FC_in(i, j, k, 0) = 0.0;
  });

#ifdef MOD_REACTOR
  time = time_init + dt_react;
#endif
  return 0;
}